

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O1

void emitter_kv_note(emitter_t *emitter,char *json_key,char *table_key,emitter_type_t value_type,
                    void *value,char *table_note_key,emitter_type_t table_note_value_type,
                    void *table_note_value)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  
  if (emitter->output < emitter_output_table) {
    if (emitter->emitted_key == true) {
      emitter->emitted_key = false;
    }
    else {
      if (emitter->item_at_depth == true) {
        emitter_printf(emitter,",");
      }
      if (emitter->output != emitter_output_json_compact) {
        emitter_printf(emitter,anon_var_dwarf_6435278 + 8);
        pcVar2 = anon_var_dwarf_6435659 + 7;
        if (emitter->output != emitter_output_json) {
          pcVar2 = " ";
        }
        if (0 < emitter->nesting_depth) {
          iVar1 = emitter->nesting_depth << (emitter->output != emitter_output_json);
          iVar3 = 1;
          if (1 < iVar1) {
            iVar3 = iVar1;
          }
          do {
            emitter_printf(emitter,"%s",pcVar2);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
      }
    }
    pcVar2 = anon_var_dwarf_643533f + 9;
    if (emitter->output != emitter_output_json_compact) {
      pcVar2 = " ";
    }
    emitter_printf(emitter,"\"%s\":%s",json_key,pcVar2);
    emitter->emitted_key = true;
    if (emitter_output_json_compact < emitter->output) goto LAB_011a20a1;
    if (emitter->emitted_key == true) {
      emitter->emitted_key = false;
    }
    else {
      if (emitter->item_at_depth == true) {
        emitter_printf(emitter,",");
      }
      if (emitter->output != emitter_output_json_compact) {
        emitter_printf(emitter,anon_var_dwarf_6435278 + 8);
        pcVar2 = anon_var_dwarf_6435659 + 7;
        if (emitter->output != emitter_output_json) {
          pcVar2 = " ";
        }
        if (0 < emitter->nesting_depth) {
          iVar1 = emitter->nesting_depth << (emitter->output != emitter_output_json);
          iVar3 = 1;
          if (1 < iVar1) {
            iVar3 = iVar1;
          }
          do {
            emitter_printf(emitter,"%s",pcVar2);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
      }
    }
    emitter_print_value(emitter,emitter_justify_none,-1,value_type,value);
  }
  else if (emitter->output == emitter_output_table) {
    if (0 < emitter->nesting_depth) {
      iVar3 = emitter->nesting_depth * 2;
      iVar1 = 1;
      if (1 < iVar3) {
        iVar1 = iVar3;
      }
      do {
        emitter_printf(emitter,"%s"," ");
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    emitter_printf(emitter,"%s: ",table_key);
    emitter_print_value(emitter,emitter_justify_none,-1,value_type,value);
    if (table_note_key != (char *)0x0) {
      emitter_printf(emitter," (%s: ",table_note_key);
      emitter_print_value(emitter,emitter_justify_none,-1,table_note_value_type,table_note_value);
      emitter_printf(emitter,")");
    }
    emitter_printf(emitter,anon_var_dwarf_6435278 + 8);
  }
  emitter->item_at_depth = true;
LAB_011a20a1:
  emitter->item_at_depth = true;
  return;
}

Assistant:

static inline void
emitter_kv_note(emitter_t *emitter, const char *json_key, const char *table_key,
    emitter_type_t value_type, const void *value,
    const char *table_note_key, emitter_type_t table_note_value_type,
    const void *table_note_value) {
	if (emitter_outputs_json(emitter)) {
		emitter_json_key(emitter, json_key);
		emitter_json_value(emitter, value_type, value);
	} else {
		emitter_table_kv_note(emitter, table_key, value_type, value,
		    table_note_key, table_note_value_type, table_note_value);
	}
	emitter->item_at_depth = true;
}